

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.cpp
# Opt level: O2

void __thiscall TPZSavable::Write(TPZSavable *this,TPZStream *buf,int withclassid)

{
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Save/TPZSavable.cpp",
             0x31);
}

Assistant:

void TPZSavable::Write(TPZStream &buf, int withclassid) const
{
    DebugStop();
	if(withclassid) { 
		int var = ClassId();
		if(var == -1)
		{
			std::cout << "TPZSavable::Write const with classid -1 expect trouble\n";
		}
		//buf.Write(&var,1);
	}
}